

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleTable::parent(QAccessibleTable *this)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  QAccessibleInterface *pQVar4;
  QAccessibleObject *pQVar5;
  QObject *pQVar6;
  
  pQVar5 = &this->super_QAccessibleObject;
  (**(code **)(*(long *)&this->super_QAccessibleObject + 0x18))(pQVar5);
  lVar2 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar6 = QCoreApplication::self;
  if (lVar2 != 0) {
    (**(code **)(*(long *)pQVar5 + 0x18))(pQVar5);
    lVar2 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
    pQVar6 = QCoreApplication::self;
    if (*(long *)(*(long *)(lVar2 + 8) + 0x10) != 0) {
      (**(code **)(*(long *)pQVar5 + 0x18))(pQVar5);
      lVar2 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
      (**(code **)**(undefined8 **)(*(long *)(lVar2 + 8) + 0x10))();
      pcVar3 = (char *)QMetaObject::className();
      iVar1 = qstrcmp("QComboBoxPrivateContainer",pcVar3);
      (**(code **)(*(long *)pQVar5 + 0x18))(pQVar5);
      lVar2 = QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
      pQVar6 = *(QObject **)(*(long *)(lVar2 + 8) + 0x10);
      if (iVar1 == 0) {
        pQVar6 = *(QObject **)(*(long *)(pQVar6 + 8) + 0x10);
      }
    }
  }
  pQVar4 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar6);
  return pQVar4;
}

Assistant:

QAccessibleInterface *QAccessibleTable::parent() const
{
    if (view() && view()->parent()) {
        if (qstrcmp("QComboBoxPrivateContainer", view()->parent()->metaObject()->className()) == 0) {
            return QAccessible::queryAccessibleInterface(view()->parent()->parent());
        }
        return QAccessible::queryAccessibleInterface(view()->parent());
    }
    return QAccessible::queryAccessibleInterface(qApp);
}